

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O2

uint32_t Ngram_bow(Ngram model,uint32_t *gram_words,uint32_t gram_len)

{
  LowGram_T *pLVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t *puVar5;
  UniGram_T *pUVar6;
  UniGram_T *pUVar7;
  ulong uVar8;
  ulong uVar4;
  
  pUVar6 = model->uni_gram + *gram_words;
  if (gram_len == 1) {
    puVar5 = &pUVar6->bow;
  }
  else {
    if (model->ngram_order <= gram_len) {
      return 0;
    }
    pUVar7 = model->uni_gram + (*gram_words + 1);
    uVar4 = 0xffffffffffffffff;
    for (uVar8 = 1; uVar8 < gram_len; uVar8 = uVar8 + 1) {
      uVar3 = pUVar6->next_arr_idx;
      pLVar1 = model->low_grams[uVar8 - 1];
      uVar2 = search_low_gram(gram_words[uVar8],pLVar1 + uVar3,(ulong)(pUVar7->next_arr_idx - uVar3)
                             );
      uVar3 = uVar2 + uVar3;
      uVar4 = (ulong)uVar3;
      if (gram_len - 1 == uVar8) {
        puVar5 = &pLVar1[uVar3].bow;
        goto LAB_001032b2;
      }
      if (uVar3 == 0xffffffff) {
        return 0xffffffff;
      }
      pUVar6 = (UniGram_T *)&pLVar1[uVar3].next_arr_idx;
      pUVar7 = (UniGram_T *)&pLVar1[(ulong)uVar3 + 1].next_arr_idx;
    }
    puVar5 = &model->low_grams[uVar8 - 1][uVar4 & 0xffffffff].bow;
  }
LAB_001032b2:
  return *puVar5;
}

Assistant:

uint32_t Ngram_bow(const Ngram model, const uint32_t* gram_words, uint32_t gram_len){
    uint32_t cur_word_id = gram_words[0];
    uint32_t next_word_start = model->uni_gram[cur_word_id].next_arr_idx;
    uint32_t next_word_end = model->uni_gram[cur_word_id+1].next_arr_idx;
    if (gram_len == 1) {
        return model->uni_gram[cur_word_id].bow;
    }
    if (gram_len >= model->ngram_order) {
        return 0;
    }
    uint32_t next = -1;
    uint32_t ngram_idx = 0;
    for (uint32_t j = 1; j < gram_len;j++) {
        next = search_low_gram(gram_words[j], model->low_grams[ngram_idx] + next_word_start, next_word_end - next_word_start)+next_word_start; 
        if(j == gram_len -1){
           return model->low_grams[ngram_idx][next].bow;
        }
        if (next == -1) {
            return -1;
        }else{
            next_word_start = model->low_grams[ngram_idx][next].next_arr_idx;
            next_word_end = model->low_grams[ngram_idx][next+1].next_arr_idx;
        }
        ngram_idx+=1;
    }
    return model->low_grams[ngram_idx][next].bow;
}